

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O0

void __thiscall kj::_::Debug::Fault::fatal(Fault *this)

{
  Exception *pEVar1;
  undefined1 local_168 [8];
  Exception copy;
  Fault *this_local;
  
  copy._336_8_ = this;
  pEVar1 = mv<kj::Exception>(this->exception);
  Exception::Exception((Exception *)local_168,pEVar1);
  pEVar1 = this->exception;
  if (pEVar1 != (Exception *)0x0) {
    Exception::~Exception(pEVar1);
    operator_delete(pEVar1,0x158);
  }
  this->exception = (Exception *)0x0;
  pEVar1 = mv<kj::Exception>((Exception *)local_168);
  throwFatalException(pEVar1,2);
}

Assistant:

void Debug::Fault::fatal() {
  Exception copy = mv(*exception);
  delete exception;
  exception = nullptr;
  throwFatalException(mv(copy), 2);
  abort();
}